

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.c
# Opt level: O3

int lookup_trace(char *chipset,char *event)

{
  int iVar1;
  FILE *pFVar2;
  char *pcVar3;
  void *__ptr;
  rnndecaddrinfo *a;
  uint uVar4;
  ulong addr_00;
  long lVar5;
  ulong value_00;
  uint uVar6;
  uint32_t mask;
  uint32_t value;
  uint32_t addr;
  char buf [1024];
  char cmd [1024];
  int local_848;
  int local_844;
  int local_840;
  int local_83c;
  char local_838 [1024];
  char local_438 [1032];
  
  sprintf(local_438,
          "demmt -l %s.trace -m %s -d all -e nvrm-mthd=0x20800122  -e ioctl-desc 2> /dev/null | grep dir > %s.demmt"
          ,event,chipset);
  pFVar2 = popen(local_438,"r");
  if (pFVar2 == (FILE *)0x0) {
    pcVar3 = "popen";
  }
  else {
    pcVar3 = fgets(local_838,0x400,pFVar2);
    if (pcVar3 != (char *)0x0) {
      do {
        printf("%s",local_838);
        pcVar3 = fgets(local_838,0x400,pFVar2);
      } while (pcVar3 != (char *)0x0);
    }
    iVar1 = pclose(pFVar2);
    if (-1 < iVar1) {
      sprintf(local_838,"%s.demmt",event);
      pFVar2 = fopen(local_838,"r");
      if (pFVar2 == (FILE *)0x0) {
        pcVar3 = "fopen";
      }
      else {
        __ptr = calloc(1,0x8004);
        if (__ptr != (void *)0x0) {
          pcVar3 = fgets(local_438,0x400,pFVar2);
          if (pcVar3 == (char *)0x0) {
            fclose(pFVar2);
          }
          else {
            uVar4 = 0;
            do {
              pcVar3 = strstr(local_438,"dir:");
              if (pcVar3 == (char *)0x0) {
LAB_00102840:
                fclose(pFVar2);
                free(__ptr);
                return 1;
              }
              __isoc99_sscanf(pcVar3 + 5,"0x%08x",&local_848);
              pcVar3 = strstr(local_438,"mmio:");
              if (pcVar3 == (char *)0x0) goto LAB_00102840;
              __isoc99_sscanf(pcVar3 + 6,"0x%08x",&local_83c);
              pcVar3 = strstr(local_438,"value:");
              if (pcVar3 == (char *)0x0) goto LAB_00102840;
              __isoc99_sscanf(pcVar3 + 7,"0x%08x",&local_840);
              pcVar3 = strstr(local_438,"mask:");
              if (pcVar3 == (char *)0x0) goto LAB_00102840;
              __isoc99_sscanf(pcVar3 + 6,"0x%08x",&local_844);
              if (0 < (int)uVar4) {
                lVar5 = 0;
                do {
                  if ((((*(int *)((long)__ptr + lVar5) == local_848) &&
                       (*(int *)((long)__ptr + lVar5 + 4) == local_83c)) &&
                      (*(int *)((long)__ptr + lVar5 + 8) == local_840)) &&
                     (*(int *)((long)__ptr + lVar5 + 0xc) == local_844)) goto LAB_00102739;
                  lVar5 = lVar5 + 0x10;
                } while ((ulong)uVar4 << 4 != lVar5);
              }
              lVar5 = (long)(int)uVar4;
              uVar4 = uVar4 + 1;
              *(uint *)((long)__ptr + 0x8000) = uVar4;
              lVar5 = lVar5 * 0x10;
              *(int *)((long)__ptr + lVar5) = local_848;
              *(int *)((long)__ptr + lVar5 + 4) = local_83c;
              *(int *)((long)__ptr + lVar5 + 0xc) = local_844;
              *(int *)((long)__ptr + lVar5 + 8) = local_840;
LAB_00102739:
              pcVar3 = fgets(local_438,0x400,pFVar2);
            } while (pcVar3 != (char *)0x0);
            fclose(pFVar2);
            if (0 < (int)uVar4) {
              lVar5 = 0;
              do {
                addr_00 = (ulong)*(uint *)((long)__ptr + lVar5 + 4);
                uVar6 = *(uint *)((long)__ptr + lVar5) & 1;
                value_00 = (ulong)*(uint *)((long)__ptr + lVar5 + 8);
                printf("(%c) register: %06x, value: %08x, mask: %08x ",(ulong)(uVar6 * 5 + 0x72),
                       addr_00,value_00,(ulong)*(uint *)((long)__ptr + lVar5 + 0xc));
                pcVar3 = "<==";
                if (uVar6 == 0) {
                  pcVar3 = "==>";
                }
                printf("%s ",pcVar3);
                a = rnndec_decodeaddr(rnnctx,rnndom,addr_00,0);
                if (a == (rnndecaddrinfo *)0x0) {
                  lookup_trace_cold_1();
                  return 1;
                }
                if (a->typeinfo == (rnntypeinfo *)0x0) {
                  puts(a->name);
                }
                else {
                  pcVar3 = rnndec_decodeval(rnnctx,a->typeinfo,value_00,a->width);
                  printf("%s => %s\n",a->name,pcVar3);
                  free(pcVar3);
                }
                rnndec_free_decaddrinfo(a);
                lVar5 = lVar5 + 0x10;
              } while ((ulong)uVar4 << 4 != lVar5);
            }
          }
          free(__ptr);
          return 0;
        }
        pcVar3 = "malloc";
      }
      perror(pcVar3);
      return 1;
    }
    pcVar3 = "pclose";
  }
  perror(pcVar3);
  fwrite("Failed to decode trace using demmt!\n",0x24,1,_stderr);
  return 1;
}

Assistant:

int
lookup_trace(const char *chipset, const char *event)
{
	struct trace *t;
	int i;

	if (decode_trace(chipset, event)) {
		fprintf(stderr, "Failed to decode trace using demmt!\n");
		return 1;
	}

	if (!(t = parse_trace(event)))
		return 1;

	for (i = 0; i < t->nb_ioctl; i++) {
		struct ioctl_call *c = &t->ioctls[i];

		printf("(%c) register: %06x, value: %08x, mask: %08x ",
		       (c->dir & 0x1 ? 'w' : 'r'), c->addr, c->value, c->mask);
		printf("%s ", (c->dir & 0x1 ? "<==" : "==>"));

		if (lookup(c->addr, c->value)) {
			fprintf(stderr, "Failed to decode addr using lookup!\n");
			return 1;
		}
	}
	free(t);

	return 0;
}